

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

void parse_output_preds(options_i *options,vw *all)

{
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  _Alloc_hider __s;
  options_i *poVar3;
  vw *pvVar4;
  int iVar5;
  option_group_definition *this;
  ostream *poVar6;
  size_t sVar7;
  string raw_predictions;
  string predictions;
  option_group_definition output_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  options_i *local_298;
  vw *local_290;
  string local_288;
  undefined1 *local_268;
  long local_260;
  undefined1 local_258 [16];
  option_group_definition local_248;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  string local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 local_170 [80];
  string local_120 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [80];
  string local_80 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_290 = all;
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Output options","");
  local_248.m_name._M_dataplus._M_p = (pointer)&local_248.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_248,local_268,local_268 + local_260);
  local_248.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"predictions","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_170,&local_288,&local_2b8);
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"p","");
  std::__cxx11::string::_M_assign(local_120);
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"File to output predictions to","");
  local_298 = options;
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                   (&local_248,
                    (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_170);
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"raw_predictions","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_1d0,&local_2d8);
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"r","");
  std::__cxx11::string::_M_assign(local_80);
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_210,"File to output unnormalized predictions to","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (this,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  pvVar4 = local_290;
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002d5018;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  poVar3 = local_298;
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  if (local_190[0] != local_180) {
    operator_delete(local_190[0]);
  }
  local_170._0_8_ = &PTR__typed_option_002d5018;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  (**poVar3->_vptr_options_i)(poVar3,&local_248);
  pp_Var2 = (_func_int **)(local_170 + 0x10);
  local_170._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"predictions","");
  iVar5 = (*poVar3->_vptr_options_i[1])(poVar3,local_170);
  if ((_func_int **)local_170._0_8_ != pp_Var2) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar5 != '\0') {
    if (pvVar4->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pvVar4->trace_message).super_ostream,"predictions = ",0xe);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (&(pvVar4->trace_message).super_ostream,local_2b8._M_dataplus._M_p,
                          local_2b8._M_string_length);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_2b8);
    __s._M_p = local_2b8._M_dataplus._M_p;
    if (iVar5 == 0) {
      local_170._0_4_ = 1;
      v_array<int>::push_back(&pvVar4->final_prediction_sink,(int *)local_170);
    }
    else {
      iVar5 = open64(local_2b8._M_dataplus._M_p,0x241,0x1b6);
      if (iVar5 < 0) {
        pvVar1 = &pvVar4->trace_message;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,"Error opening the predictions file: ",0x24);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__s._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)pvVar1 + (int)(pvVar1->super_ostream)._vptr_basic_ostream[-3]);
        }
        else {
          sVar7 = strlen(__s._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(&pvVar1->super_ostream,__s._M_p,sVar7);
        }
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
      local_170._0_4_ = iVar5;
      v_array<int>::push_back(&pvVar4->final_prediction_sink,(int *)local_170);
    }
  }
  local_170._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"raw_predictions","");
  iVar5 = (*poVar3->_vptr_options_i[1])(poVar3,local_170);
  if ((_func_int **)local_170._0_8_ != pp_Var2) {
    operator_delete((void *)local_170._0_8_);
  }
  if ((char)iVar5 != '\0') {
    if (pvVar4->quiet == false) {
      pvVar1 = &pvVar4->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"raw predictions = ",0x12);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (&pvVar1->super_ostream,local_2d8._M_dataplus._M_p,
                          local_2d8._M_string_length);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      local_170._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"binary","");
      iVar5 = (*poVar3->_vptr_options_i[1])(poVar3,local_170);
      if ((_func_int **)local_170._0_8_ != pp_Var2) {
        operator_delete((void *)local_170._0_8_);
      }
      if ((char)iVar5 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pvVar1->super_ostream,
                   "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                   ,0x59);
        std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
        std::ostream::put((char)pvVar1);
        std::ostream::flush();
      }
    }
    iVar5 = std::__cxx11::string::compare((char *)&local_2d8);
    if (iVar5 == 0) {
      iVar5 = 1;
    }
    else {
      iVar5 = open64(local_2d8._M_dataplus._M_p,0x241,0x1b6);
    }
    pvVar4->raw_prediction = iVar5;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_248.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
    operator_delete(local_248.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void parse_output_preds(options_i& options, vw& all)
{
  std::string predictions;
  std::string raw_predictions;

  option_group_definition output_options("Output options");
  output_options.add(make_option("predictions", predictions).short_name("p").help("File to output predictions to"))
      .add(make_option("raw_predictions", raw_predictions)
               .short_name("r")
               .help("File to output unnormalized predictions to"));
  options.add_and_parse(output_options);

  if (options.was_supplied("predictions"))
  {
    if (!all.quiet)
      all.trace_message << "predictions = " << predictions << endl;

    if (predictions == "stdout")
    {
      all.final_prediction_sink.push_back((size_t)1);  // stdout
    }
    else
    {
      const char* fstr = predictions.c_str();
      int f;
      // TODO can we migrate files to fstreams?
#ifdef _WIN32
      _sopen_s(&f, fstr, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(fstr, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      if (f < 0)
        all.trace_message << "Error opening the predictions file: " << fstr << endl;
      all.final_prediction_sink.push_back((size_t)f);
    }
  }

  if (options.was_supplied("raw_predictions"))
  {
    if (!all.quiet)
    {
      all.trace_message << "raw predictions = " << raw_predictions << endl;
      if (options.was_supplied("binary"))
        all.trace_message << "Warning: --raw_predictions has no defined value when --binary specified, expect no output"
                          << endl;
    }
    if (raw_predictions == "stdout")
      all.raw_prediction = 1;  // stdout
    else
    {
      const char* t = raw_predictions.c_str();
      int f;
#ifdef _WIN32
      _sopen_s(&f, t, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
      f = open(t, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
      all.raw_prediction = f;
    }
  }
}